

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O1

S1Interval __thiscall S1Interval::Complement(S1Interval *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  S1Interval SVar4;
  S2LogMessage local_20;
  
  dVar3 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
    bVar1 = false;
    if ((ABS(dVar3) <= 3.141592653589793) && (bVar1 = false, ABS(dVar2) <= 3.141592653589793)) {
      if ((((dVar3 == 3.141592653589793) && (!NAN(dVar3))) || (dVar2 != -3.141592653589793)) ||
         (NAN(dVar2))) {
        if ((dVar3 != -3.141592653589793) || (NAN(dVar3))) {
          bVar1 = true;
        }
        else {
          bVar1 = dVar2 == 3.141592653589793;
        }
      }
      else {
        bVar1 = false;
      }
    }
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                 ,0xe4,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_20.stream_,"Check failed: is_valid() ",0x19);
      abort();
    }
  }
  else {
    dVar2 = -3.141592653589793;
    dVar3 = 3.141592653589793;
  }
  SVar4.bounds_.c_[1] = dVar3;
  SVar4.bounds_.c_[0] = dVar2;
  return (S1Interval)SVar4.bounds_.c_;
}

Assistant:

bool S1Interval::Contains(const S1Interval& y) const {
  // It might be helpful to compare the structure of these tests to
  // the simpler Contains(double) method above.

  if (is_inverted()) {
    if (y.is_inverted()) return y.lo() >= lo() && y.hi() <= hi();
    return (y.lo() >= lo() || y.hi() <= hi()) && !is_empty();
  } else {
    if (y.is_inverted()) return is_full() || y.is_empty();
    return y.lo() >= lo() && y.hi() <= hi();
  }
}